

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors.cpp
# Opt level: O1

int __thiscall SensorBase::init(SensorBase *this,EVP_PKEY_CTX *ctx)

{
  path *ppVar1;
  path *ctx_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  mapped_type *pmVar7;
  uint uVar8;
  size_type *psVar9;
  ulong uVar10;
  ulong uVar11;
  uint __uval;
  uint __val;
  uint uVar12;
  float fVar13;
  path offset_path;
  path scale_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  path name_path;
  path local_f8;
  path local_d0;
  path local_a8;
  path *local_80;
  string_type local_78;
  path local_58;
  
  uVar12 = (uint)ctx;
  __val = -uVar12;
  if (0 < (int)uVar12) {
    __val = uVar12;
  }
  uVar12 = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar12 = uVar4;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_0010c729;
      }
      if (uVar8 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_0010c729;
      }
      if (uVar8 < 10000) goto LAB_0010c729;
      uVar10 = uVar10 / 10000;
      uVar4 = uVar12 + 4;
    } while (99999 < uVar8);
    uVar12 = uVar12 + 1;
  }
LAB_0010c729:
  uVar10 = (ulong)ctx >> 0x1f & 1;
  local_f8._M_pathname._M_dataplus._M_p = (pointer)&local_f8._M_pathname.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_f8,(char)uVar12 + (char)uVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_f8._M_pathname._M_dataplus._M_p + uVar10,uVar12,__val);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x1112fd);
  local_d0._M_pathname._M_dataplus._M_p = (pointer)&local_d0._M_pathname.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_d0._M_pathname.field_2._M_allocated_capacity = *psVar9;
    local_d0._M_pathname.field_2._8_8_ = plVar6[3];
  }
  else {
    local_d0._M_pathname.field_2._M_allocated_capacity = *psVar9;
    local_d0._M_pathname._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_d0._M_pathname._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::filesystem::__cxx11::path::path(&local_58,&local_d0._M_pathname,auto_format);
  ppVar1 = &this->sysfspath;
  if (&local_58 != ppVar1) {
    init((EVP_PKEY_CTX *)ppVar1);
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_pathname._M_dataplus._M_p != &local_d0._M_pathname.field_2) {
    operator_delete(local_d0._M_pathname._M_dataplus._M_p,
                    local_d0._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_80 = ppVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_pathname._M_dataplus._M_p != &local_f8._M_pathname.field_2) {
    operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                    local_f8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  uVar12 = 1;
  if (9 < __val) {
    uVar11 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar12 = uVar4;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_0010c891;
      }
      if (uVar8 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_0010c891;
      }
      if (uVar8 < 10000) goto LAB_0010c891;
      uVar11 = uVar11 / 10000;
      uVar4 = uVar12 + 4;
    } while (99999 < uVar8);
    uVar12 = uVar12 + 1;
  }
LAB_0010c891:
  local_f8._M_pathname._M_dataplus._M_p = (pointer)&local_f8._M_pathname.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_f8,(char)uVar10 + (char)uVar12);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_f8._M_pathname._M_dataplus._M_p + uVar10,uVar12,__val);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x11131d);
  ppVar1 = local_80;
  paVar2 = &local_d0._M_pathname.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_d0._M_pathname.field_2._M_allocated_capacity = *psVar9;
    local_d0._M_pathname.field_2._8_8_ = plVar6[3];
    local_d0._M_pathname._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d0._M_pathname.field_2._M_allocated_capacity = *psVar9;
    local_d0._M_pathname._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_d0._M_pathname._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::filesystem::__cxx11::path::path(&local_58,&local_d0._M_pathname,auto_format);
  ctx_00 = &this->devbufpath;
  if (&local_58 != ctx_00) {
    init((EVP_PKEY_CTX *)ctx_00);
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_pathname._M_dataplus._M_p,
                    local_d0._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_pathname._M_dataplus._M_p != &local_f8._M_pathname.field_2) {
    operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                    local_f8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)&this->sensor_basename);
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_d0,(char (*) [5])"name",auto_format);
  std::filesystem::__cxx11::operator/(&local_58,ppVar1,&local_d0);
  std::filesystem::__cxx11::path::~path(&local_d0);
  readstr_abi_cxx11_(&local_d0._M_pathname,local_58._M_pathname._M_dataplus._M_p,0x100);
  std::__cxx11::string::operator=((string *)&this->type,(string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_pathname._M_dataplus._M_p,
                    local_d0._M_pathname.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_a8._M_pathname.field_2;
  pcVar3 = (this->sensor_basename)._M_dataplus._M_p;
  local_a8._M_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,pcVar3 + (this->sensor_basename)._M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  std::filesystem::__cxx11::path::path(&local_f8,&local_a8._M_pathname,auto_format);
  std::filesystem::__cxx11::operator/(&local_d0,ppVar1,&local_f8);
  std::filesystem::__cxx11::path::~path(&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                    local_a8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  fVar13 = readfloat(local_d0._M_pathname._M_dataplus._M_p);
  local_a8._M_pathname._M_dataplus._M_p._0_4_ = fVar13;
  local_f8._M_pathname._M_dataplus._M_p = (pointer)&local_f8._M_pathname.field_2;
  pcVar3 = (this->sensor_basename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,pcVar3 + (this->sensor_basename)._M_string_length);
  std::__cxx11::string::append((char *)&local_f8);
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->dict,&local_f8._M_pathname);
  std::any::operator=(pmVar7,(float *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_pathname._M_dataplus._M_p != &local_f8._M_pathname.field_2) {
    operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                    local_f8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->sensor_basename)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (this->sensor_basename)._M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  std::filesystem::__cxx11::path::path(&local_a8,&local_78,auto_format);
  std::filesystem::__cxx11::operator/(&local_f8,ppVar1,&local_a8);
  std::filesystem::__cxx11::path::~path(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  fVar13 = readfloat(local_f8._M_pathname._M_dataplus._M_p);
  local_78._M_dataplus._M_p._0_4_ = fVar13;
  pcVar3 = (this->sensor_basename)._M_dataplus._M_p;
  local_a8._M_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,pcVar3 + (this->sensor_basename)._M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->dict,&local_a8._M_pathname);
  std::any::operator=(pmVar7,(float *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                    local_a8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  reset(this);
  pipe(this->qpipe);
  std::
  vector<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>_>_>
  ::_M_erase_at_end(&this->enabled_scan_elem,
                    (this->enabled_scan_elem).
                    super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (**this->_vptr_SensorBase)(this);
  (*this->_vptr_SensorBase[1])(this);
  enable_buffer(this);
  iVar5 = open((ctx_00->_M_pathname)._M_dataplus._M_p,0);
  this->devfd = iVar5;
  if (iVar5 == -1) {
    init((EVP_PKEY_CTX *)ctx_00);
  }
  std::filesystem::__cxx11::path::~path(&local_f8);
  std::filesystem::__cxx11::path::~path(&local_d0);
  std::filesystem::__cxx11::path::~path(&local_58);
  return (int)CONCAT71((int7)((ulong)this >> 8),iVar5 == -1);
}

Assistant:

bool SensorBase::init(int id,std::string _sensor_basename)
{
	sysfspath=IIODEV_SYSFS_PATH_BASE+std::to_string(id);
	devbufpath=DEV_PATH+std::to_string(id);
	sensor_basename=_sensor_basename;

	using filesystem::path;
	path name_path=sysfspath/"name";
	type=readstr(name_path.c_str());
	path scale_path=sysfspath/(sensor_basename+"_scale");
	dict[sensor_basename+"_scale"]=readfloat(scale_path.c_str());
	path offset_path=sysfspath/(sensor_basename+"_offset");
	dict[sensor_basename+"_offset"]=readfloat(offset_path.c_str());

	reset();
	ignore_result(pipe(qpipe));
	enabled_scan_elem.clear();
	enable_scan_elements();
	update_values();
	enable_buffer();
	devfd=open(devbufpath.c_str(),O_RDONLY);
	if(!~devfd)
		return LOG('E',"failed to open the iio buffer device: %s",devbufpath.c_str()),1;
	return 0;
}